

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall
wasm::GenerateDynCalls::generateDynCallThunk(GenerateDynCalls *this,HeapType funcType)

{
  pointer *ppNVar1;
  undefined8 *puVar2;
  Module *pMVar3;
  uintptr_t uVar4;
  string_view sVar5;
  string_view sVar6;
  char *pcVar7;
  Builder BVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  pointer pNVar12;
  Type *pTVar13;
  undefined8 *puVar14;
  Function *pFVar15;
  Export *pEVar16;
  Type *pTVar17;
  Expression *pEVar18;
  Table *pTVar19;
  pointer puVar20;
  CallIndirect *pCVar21;
  undefined1 reuse;
  Type in_RCX;
  ulong uVar22;
  MixedArena *this_00;
  pointer pNVar23;
  uint __len;
  uint __val;
  Type *__range1;
  Id IVar24;
  string_view sVar25;
  Name NVar26;
  string_view s;
  Signature sig_00;
  Name name;
  Name name_00;
  Name name_01;
  undefined1 auStack_288 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> args;
  HeapType local_f8;
  HeapType funcType_local;
  Type local_e8;
  Expression *local_e0;
  Address local_d8;
  Module *local_d0;
  Expression *local_c8;
  Builder local_c0;
  Builder builder;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_b0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> f;
  Signature sig;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *local_90;
  undefined1 auStack_88 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  undefined1 auStack_68 [8];
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> namedParams;
  undefined1 auStack_48 [8];
  Iterator __begin1_1;
  
  local_f8.id = funcType.id;
  _f = HeapType::getSignature(&local_f8);
  bVar10 = wasm::Type::isTuple(&sig.params);
  if (bVar10) {
    Fatal::Fatal((Fatal *)auStack_288);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)
               &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
               "GenerateDynCalls: Cannot operate on multiple return values:",0x3b);
    Fatal::operator<<((Fatal *)auStack_288,&sig.params);
    Fatal::~Fatal((Fatal *)auStack_288);
  }
  if (this->onlyI64 == true) {
    auStack_288 = (undefined1  [8])
                  f._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)sig.params.id;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_68 = (undefined1  [8])&args;
    pNVar12 = (pointer)wasm::Type::size((Type *)&args);
    if (pNVar12 != (pointer)0x0) {
      do {
        pTVar13 = wasm::Type::Iterator::operator*((Iterator *)auStack_68);
        if (pTVar13->id == 3) goto LAB_006f403f;
        in_RCX.id = (long)&((namedParams.
                             super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                             _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                           _M_len + 1;
        namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)in_RCX.id;
      } while (((pointer)in_RCX.id != pNVar12) || (auStack_68 != (undefined1  [8])&args));
    }
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_68 = (undefined1  [8])auStack_288;
    pNVar12 = (pointer)wasm::Type::size((Type *)auStack_288);
    if (pNVar12 == (pointer)0x0) {
      return;
    }
    while (pTVar13 = wasm::Type::Iterator::operator*((Iterator *)auStack_68), pTVar13->id != 3) {
      in_RCX.id = (long)&((namedParams.
                           super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                           _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str._M_len
                  + 1;
      namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)in_RCX.id;
      if (((pointer)in_RCX.id == pNVar12) && (auStack_68 == (undefined1  [8])auStack_288)) {
        return;
      }
    }
  }
LAB_006f403f:
  pMVar3 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>_>
           ).super_PostWalker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
           super_Walker<wasm::GenerateDynCalls,_wasm::Visitor<wasm::GenerateDynCalls,_void>_>.
           currModule;
  ppNVar1 = &namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_c0.wasm = pMVar3;
  auStack_68 = (undefined1  [8])ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)auStack_68,"dynCall_","");
  getSig_abi_cxx11_((string *)auStack_88,(wasm *)sig.params.id,
                    (Type)f._M_t.
                          super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                          .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,in_RCX);
  pNVar12 = (pointer)((long)&((namedParams.
                               super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                               _M_impl.super__Vector_impl_data._M_start)->name).super_IString.str.
                             _M_len +
                     (long)&(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                             _M_impl.super__Vector_impl_data._M_start)->id);
  pNVar23 = (pointer)0xf;
  if (auStack_68 != (undefined1  [8])ppNVar1) {
    pNVar23 = namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  if (pNVar23 < pNVar12) {
    pNVar23 = (pointer)0xf;
    if (auStack_88 !=
        (undefined1  [8])
        &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish) {
      pNVar23 = (pointer)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    if (pNVar12 <= pNVar23) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)auStack_88,0,(char *)0x0,(ulong)auStack_68);
      goto LAB_006f40d9;
    }
  }
  puVar14 = (undefined8 *)std::__cxx11::string::_M_append(auStack_68,(ulong)auStack_88);
LAB_006f40d9:
  auStack_288 = (undefined1  [8])
                &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = puVar14 + 2;
  if ((pointer *)*puVar14 == (pointer *)puVar2) {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)puVar14[3];
  }
  else {
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)*puVar2;
    auStack_288 = (undefined1  [8])*puVar14;
  }
  args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)puVar14[1];
  *puVar14 = puVar2;
  puVar14[1] = 0;
  *(undefined1 *)puVar2 = 0;
  s._M_str = (char *)0x0;
  s._M_len = (size_t)auStack_288;
  sVar25 = IString::interned((IString *)
                             args.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,s,SUB81(puVar2,0));
  if (auStack_288 !=
      (undefined1  [8])
      &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_288,
                    (long)args.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 1);
  }
  if (auStack_88 !=
      (undefined1  [8])
      &params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete((void *)auStack_88,
                    (ulong)((long)&(params.
                                    super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish)->id + 1));
  }
  if (auStack_68 != (undefined1  [8])ppNVar1) {
    operator_delete((void *)auStack_68,
                    (ulong)((long)&((namedParams.
                                     super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->name).
                                   super_IString.str._M_len + 1));
  }
  pFVar15 = Module::getFunctionOrNull(pMVar3,(Name)sVar25);
  if ((pFVar15 == (Function *)0x0) &&
     (pEVar16 = Module::getExportOrNull(pMVar3,(Name)sVar25), pEVar16 == (Export *)0x0)) {
    auStack_68 = (undefined1  [8])0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    namedParams.super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_88 = (undefined1  [8])0x0;
    params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    auStack_288._0_4_ = 2;
    std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
    emplace_back<char_const(&)[5],wasm::Type::BasicType>
              ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_68,
               (char (*) [5])"fptr",(BasicType *)auStack_288);
    auStack_288 = (undefined1  [8])0x2;
    if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_start ==
        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::_M_realloc_insert<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_88,
                 (iterator)
                 params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                 super__Vector_impl_data._M_start,(Type *)auStack_288);
    }
    else {
      (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
       super__Vector_impl_data._M_start)->id = 2;
      params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start =
           params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    }
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    auStack_48 = (undefined1  [8])&f;
    pTVar13 = (Type *)wasm::Type::size((Type *)&f);
    local_d0 = pMVar3;
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar13) || (builder.wasm = (Module *)sVar25._M_len, auStack_48 != (undefined1  [8])&f)) {
      __val = 0;
      sVar5 = sVar25;
      do {
        local_90 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)sVar5._M_str;
        builder.wasm = (Module *)sVar5._M_len;
        pTVar17 = wasm::Type::Iterator::operator*((Iterator *)auStack_48);
        __len = 1;
        if (9 < __val) {
          uVar22 = (ulong)__val;
          uVar9 = 4;
          do {
            __len = uVar9;
            uVar11 = (uint)uVar22;
            if (uVar11 < 100) {
              __len = __len - 2;
              goto LAB_006f42d3;
            }
            if (uVar11 < 1000) {
              __len = __len - 1;
              goto LAB_006f42d3;
            }
            if (uVar11 < 10000) goto LAB_006f42d3;
            uVar22 = uVar22 / 10000;
            uVar9 = __len + 4;
          } while (99999 < uVar11);
          __len = __len + 1;
        }
LAB_006f42d3:
        auStack_288 = (undefined1  [8])
                      &args.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct((ulong)auStack_288,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)auStack_288,__len,__val);
        std::vector<wasm::NameType,std::allocator<wasm::NameType>>::
        emplace_back<std::__cxx11::string,wasm::Type_const&>
                  ((vector<wasm::NameType,std::allocator<wasm::NameType>> *)auStack_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_288,
                   pTVar17);
        sVar25._M_str = (char *)local_90;
        sVar25._M_len = (size_t)builder.wasm;
        if (auStack_288 !=
            (undefined1  [8])
            &args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
          operator_delete((void *)auStack_288,
                          (long)args.
                                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 1);
        }
        if (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_start ==
            params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::Type,std::allocator<wasm::Type>>::_M_realloc_insert<wasm::Type_const&>
                    ((vector<wasm::Type,std::allocator<wasm::Type>> *)auStack_88,
                     (iterator)
                     params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_start,pTVar17);
        }
        else {
          (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start)->id = pTVar17->id;
          params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
          super__Vector_impl_data._M_start =
               params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        sVar6._M_str = (char *)local_90;
        sVar6._M_len = (size_t)builder.wasm;
        sVar5._M_str = (char *)local_90;
        sVar5._M_len = (size_t)builder.wasm;
        __val = __val + 1;
        __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1_1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                parent != pTVar13) || (sVar5 = sVar6, auStack_48 != (undefined1  [8])&f));
    }
    local_90 = (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)sVar25._M_str;
    Tuple::Tuple((Tuple *)auStack_288,(TypeList *)auStack_88);
    wasm::Type::Type(&local_e8,(Tuple *)auStack_288);
    sig_00.results.id = sig.params.id;
    sig_00.params.id = local_e8.id;
    HeapType::HeapType(&funcType_local,sig_00);
    auStack_48 = (undefined1  [8])0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
    NVar26.super_IString.str._M_str = (char *)sVar25._M_len;
    NVar26.super_IString.str._M_len = (size_t)&local_b0;
    Builder::makeFunction
              (NVar26,local_90,(HeapType)auStack_68,
               (vector<wasm::NameType,_std::allocator<wasm::NameType>_> *)funcType_local.id,
               (Expression *)auStack_48);
    if (auStack_48 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_48,
                      __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                      .index - (long)auStack_48);
    }
    if (auStack_288 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_288,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
    }
    this_00 = &(local_c0.wasm)->allocator;
    pEVar18 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
    pEVar18->_id = LocalGetId;
    pEVar18[1]._id = InvalidId;
    (pEVar18->type).id = 2;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_288 = (undefined1  [8])0x0;
    args.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    auStack_48 = (undefined1  [8])&f;
    pTVar13 = (Type *)wasm::Type::size((Type *)&f);
    local_c8 = pEVar18;
    if ((__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
         pTVar13) || (auStack_48 != (undefined1  [8])&f)) {
      IVar24 = BlockId;
      do {
        do {
          pTVar17 = wasm::Type::Iterator::operator*((Iterator *)auStack_48);
          uVar4 = pTVar17->id;
          local_e0 = (Expression *)MixedArena::allocSpace(this_00,0x18,8);
          local_e0->_id = LocalGetId;
          local_e0[1]._id = IVar24;
          (local_e0->type).id = uVar4;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_288,
                     &local_e0);
          __begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin1_1.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
          IVar24 = IVar24 + BlockId;
        } while (__begin1_1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                 parent != pTVar13);
      } while (auStack_48 != (undefined1  [8])&f);
    }
    BVar8.wasm = builder.wasm;
    pMVar3 = local_d0;
    puVar20 = (local_d0->tables).
              super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (puVar20 ==
        (local_d0->tables).
        super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      NVar26 = Name::fromInt(0);
      wasm::Type::Type((Type *)&local_d8,(HeapType)0x1,Nullable);
      name_01.super_IString.str._M_str = NVar26.super_IString.str._M_len;
      name_01.super_IString.str._M_len = (size_t)auStack_48;
      Builder::makeTable(name_01,(Type)NVar26.super_IString.str._M_str,local_d8,(Address)0x0);
      reuse = (undefined1)local_d8.addr;
      pTVar19 = Module::addTable(pMVar3,(unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>
                                         *)auStack_48);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,0x50);
      }
      pcVar7 = DAT_00da8600;
      (pTVar19->super_Importable).module.super_IString.str._M_len = ENV;
      (pTVar19->super_Importable).module.super_IString.str._M_str = pcVar7;
      sVar25 = IString::interned((IString *)&DAT_00000019,(string_view)ZEXT816(0xb6424a),(bool)reuse
                                );
      (pTVar19->super_Importable).base.super_IString.str = sVar25;
      puVar20 = (pMVar3->tables).
                super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    pCVar21 = Builder::
              makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                        (&local_c0,
                         (IString)*(IString *)
                                   &(((puVar20->_M_t).
                                      super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>
                                      .super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl)->
                                    super_Importable).super_Named,local_c8,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_288,local_f8,false);
    *(CallIndirect **)
     ((long)local_b0._M_t.
            super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
            super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x60) = pCVar21;
    Module::addFunction(pMVar3,&local_b0);
    name.super_IString.str._M_str = (char *)local_90;
    name.super_IString.str._M_len = (size_t)BVar8.wasm;
    pFVar15 = Module::getFunctionOrNull(pMVar3,name);
    if (pFVar15 == (Function *)0x0) {
      __assert_fail("!must_export",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/GenerateDynCalls.cpp"
                    ,0x6b,"void wasm::exportFunction(Module &, Name, bool)");
    }
    name_00.super_IString.str._M_str = (char *)local_90;
    name_00.super_IString.str._M_len = (size_t)BVar8.wasm;
    pEVar16 = Module::getExportOrNull(pMVar3,name_00);
    if (pEVar16 == (Export *)0x0) {
      pEVar16 = (Export *)operator_new(0x28);
      (pEVar16->value).super_IString.str._M_len = (size_t)BVar8.wasm;
      (pEVar16->value).super_IString.str._M_str = (char *)local_90;
      (pEVar16->name).super_IString.str._M_len = (pEVar16->value).super_IString.str._M_len;
      (pEVar16->name).super_IString.str._M_str = (pEVar16->value).super_IString.str._M_str;
      pEVar16->kind = Function;
      Module::addExport(pMVar3,pEVar16);
    }
    if (auStack_288 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_288,
                      (long)args.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_288);
    }
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_b0);
    if (auStack_88 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_88,
                      (long)params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_88);
    }
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68,
                      (long)namedParams.
                            super__Vector_base<wasm::NameType,_std::allocator<wasm::NameType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)auStack_68);
    }
  }
  return;
}

Assistant:

void GenerateDynCalls::generateDynCallThunk(HeapType funcType) {
  Signature sig = funcType.getSignature();

  if (sig.results.isTuple()) {
    // Emscripten output is assumed to be MVP, and not to have multiple return
    // values. In particular, signatures in Emscripten all look like "abcd"
    // where "a" is the single return value, and "bcd" are the (in this case
    // three) parameters.
    Fatal() << "GenerateDynCalls: Cannot operate on multiple return values:"
            << sig.results;
  }

  if (onlyI64 && !hasI64(sig)) {
    return;
  }

  Module* wasm = getModule();
  Builder builder(*wasm);
  Name name = std::string("dynCall_") + getSig(sig.results, sig.params);
  if (wasm->getFunctionOrNull(name) || wasm->getExportOrNull(name)) {
    return; // module already contains this dyncall
  }
  std::vector<NameType> namedParams;
  std::vector<Type> params;
  namedParams.emplace_back("fptr", Type::i32); // function pointer param
  params.push_back(Type::i32);
  int p = 0;
  for (const auto& param : sig.params) {
    namedParams.emplace_back(std::to_string(p++), param);
    params.push_back(param);
  }
  auto f = builder.makeFunction(
    name, std::move(namedParams), Signature(Type(params), sig.results), {});
  Expression* fptr = builder.makeLocalGet(0, Type::i32);
  std::vector<Expression*> args;
  Index i = 0;
  for (const auto& param : sig.params) {
    args.push_back(builder.makeLocalGet(++i, param));
  }
  if (wasm->tables.empty()) {
    // Add an imported table in exactly the same manner as the LLVM wasm backend
    // would add one.
    auto* table = wasm->addTable(Builder::makeTable(Name::fromInt(0)));
    table->module = ENV;
    table->base = "__indirect_function_table";
  }
  f->body =
    builder.makeCallIndirect(wasm->tables[0]->name, fptr, args, funcType);

  wasm->addFunction(std::move(f));
  exportFunction(*wasm, name, true);
}